

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widget.hpp
# Opt level: O2

Widget * __thiscall cppurses::Widget::find_child<cppurses::Widget>(Widget *this,string *name)

{
  pointer puVar1;
  Widget *pWVar2;
  __type _Var3;
  pointer puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar4 = (this->children).children_.
           super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->children).children_.
           super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar4 == puVar1) {
      return (Widget *)0x0;
    }
    std::__cxx11::string::string
              ((string *)&local_50,
               (string *)
               &((puVar4->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl)->name_);
    _Var3 = std::operator==(&local_50,name);
    if (_Var3) {
      pWVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      std::__cxx11::string::~string((string *)&local_50);
      if (pWVar2 != (Widget *)0x0) {
        return (puVar4->_M_t).
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_50);
    }
    puVar4 = puVar4 + 1;
  } while( true );
}

Assistant:

Widg_t* find_child(const std::string& name) const
    {
        for (const std::unique_ptr<Widget>& widg : this->children.get()) {
            if (widg->name() == name &&
                dynamic_cast<Widg_t*>(widg.get()) != nullptr) {
                return widg.get();
            }
        }
        return nullptr;
    }